

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O2

void __thiscall
GmmLib::GmmTextureCalc::SetPlanarOffsetInfo_2
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,
          GMM_RESCREATE_CUSTOM_PARAMS_2 *CreateParams)

{
  uint uVar1;
  byte bVar2;
  GMM_PLATFORM_INFO *pGVar3;
  ulong uVar4;
  
  pGVar3 = GmmGetPlatformInfo(this->pGmmLibContext);
  if (pGVar3->TileInfo[pTexInfo->TileMode].LogicalSize != 0) {
    (pTexInfo->OffsetInfo).field_0.Plane.IsTileAlignedPlanes = true;
  }
  bVar2 = 1;
  while( true ) {
    uVar4 = (ulong)bVar2;
    uVar1 = (CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).NoOfPlanes;
    if (uVar1 < bVar2) break;
    *(ulong *)(pTexInfo->MmcHint + uVar4 * 8 + 0x78) =
         (ulong)(CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).PlaneOffset.X[uVar4];
    *(ulong *)((long)&(pTexInfo->OffsetInfo).field_0 + uVar4 * 8 + 0x28) =
         (ulong)(CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).PlaneOffset.Y[uVar4];
    bVar2 = bVar2 + 1;
  }
  (pTexInfo->OffsetInfo).field_0.Plane.NoOfPlanes = uVar1;
  return;
}

Assistant:

void GmmLib::GmmTextureCalc::SetPlanarOffsetInfo_2(GMM_TEXTURE_INFO *pTexInfo, GMM_RESCREATE_CUSTOM_PARAMS_2 &CreateParams)
{
    const GMM_PLATFORM_INFO *pPlatform;
    pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]))
    {
        pTexInfo->OffsetInfo.Plane.IsTileAlignedPlanes = true;
    }
    for(uint8_t i = 1; i <= CreateParams.NoOfPlanes; i++)
    {
        pTexInfo->OffsetInfo.Plane.X[i] = CreateParams.PlaneOffset.X[i];
        pTexInfo->OffsetInfo.Plane.Y[i] = CreateParams.PlaneOffset.Y[i];
    }
    pTexInfo->OffsetInfo.Plane.NoOfPlanes = CreateParams.NoOfPlanes;
}